

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction.cpp
# Opt level: O2

vector<RPCResult,_std::allocator<RPCResult>_> * ScriptPubKeyDoc(void)

{
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string description;
  string description_00;
  string description_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  undefined1 auVar1 [24];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  long lVar4;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCResult> __l;
  undefined4 in_stack_fffffffffffffaf8;
  undefined4 uVar5;
  undefined1 in_stack_fffffffffffffafc [12];
  pointer in_stack_fffffffffffffb08;
  pointer in_stack_fffffffffffffb10;
  pointer in_stack_fffffffffffffb18;
  undefined8 in_stack_fffffffffffffb20;
  pointer in_stack_fffffffffffffb28;
  pointer pRVar6;
  pointer in_stack_fffffffffffffb30;
  pointer pRVar7;
  pointer in_stack_fffffffffffffb38;
  pointer pRVar8;
  undefined8 in_stack_fffffffffffffb40;
  pointer in_stack_fffffffffffffb48;
  pointer pRVar9;
  allocator<char> local_49a;
  allocator<char> local_499;
  vector<RPCResult,_std::allocator<RPCResult>_> local_498;
  allocator<char> local_47a;
  allocator<char> local_479;
  vector<RPCResult,_std::allocator<RPCResult>_> local_478;
  allocator<char> local_45a;
  allocator<char> local_459;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  string local_3f8 [32];
  string local_3d8 [32];
  string local_3b8 [32];
  string local_398 [32];
  string local_378 [32];
  string local_358 [32];
  string local_338 [32];
  string local_318 [32];
  string local_2f8 [32];
  RPCResult local_2d8 [4];
  RPCResult local_b8;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_2f8,"asm",&local_459);
  std::__cxx11::string::string<std::allocator<char>>
            (local_318,"Disassembly of the output script",&local_45a);
  local_478.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_478.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_478.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._4_12_ = in_stack_fffffffffffffafc;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffaf8;
  m_key_name.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffb08;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffffb10;
  description._M_string_length = in_stack_fffffffffffffb20;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb18;
  description.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffb28;
  description.field_2._8_8_ = in_stack_fffffffffffffb30;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_fffffffffffffb40;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_fffffffffffffb38;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffffb48;
  RPCResult::RPCResult(local_2d8,STR,m_key_name,description,inner,SUB81(local_2f8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_338,"desc",&local_479);
  std::__cxx11::string::string<std::allocator<char>>
            (local_358,"Inferred descriptor for the output",&local_47a);
  local_498.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_498.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_498.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._4_12_ = in_stack_fffffffffffffafc;
  m_key_name_00._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffaf8;
  m_key_name_00.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffb08;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffffb10;
  description_00._M_string_length = in_stack_fffffffffffffb20;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb18;
  description_00.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffb28;
  description_00.field_2._8_8_ = in_stack_fffffffffffffb30;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_fffffffffffffb40;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffffb38;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffffb48;
  RPCResult::RPCResult(local_2d8 + 1,STR,m_key_name_00,description_00,inner_00,SUB81(local_338,0));
  std::__cxx11::string::string<std::allocator<char>>(local_378,"hex",&local_499);
  std::__cxx11::string::string<std::allocator<char>>
            (local_398,"The raw output script bytes, hex-encoded",&local_49a);
  pRVar9 = (pointer)0x0;
  m_key_name_01._4_12_ = in_stack_fffffffffffffafc;
  m_key_name_01._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffaf8;
  m_key_name_01.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffb08;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffffb10;
  description_01._M_string_length = in_stack_fffffffffffffb20;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb18;
  description_01.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffb28;
  description_01.field_2._8_8_ = in_stack_fffffffffffffb30;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_fffffffffffffb40;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffffb38;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  RPCResult::RPCResult
            (local_2d8 + 2,STR_HEX,m_key_name_01,description_01,inner_01,SUB81(local_378,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_3b8,"address",(allocator<char> *)&stack0xfffffffffffffb47);
  std::__cxx11::string::string<std::allocator<char>>
            (local_3d8,"The Bitcoin address (only if a well-defined address exists)",
             (allocator<char> *)&stack0xfffffffffffffb46);
  pRVar6 = (pointer)0x0;
  pRVar7 = (pointer)0x0;
  pRVar8 = (pointer)0x0;
  uVar5 = 0;
  auVar2._12_8_ = in_stack_fffffffffffffb08;
  auVar2._0_12_ = in_stack_fffffffffffffafc;
  auVar2._20_8_ = in_stack_fffffffffffffb10;
  auVar2._28_4_ = 0;
  auVar1._8_8_ = pRVar9;
  auVar1._0_8_ = in_stack_fffffffffffffb40;
  auVar1._16_8_ = 0;
  RPCResult::RPCResult
            (local_2d8 + 3,STR,(string)(auVar2 << 0x20),SUB81(local_3b8,0),
             (string)ZEXT1632(CONCAT88(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18)),
             (vector<RPCResult,_std::allocator<RPCResult>_>)(auVar1 << 0x40),true);
  std::__cxx11::string::string<std::allocator<char>>
            (local_3f8,"type",(allocator<char> *)&stack0xfffffffffffffb27);
  GetAllOutputTypes_abi_cxx11_();
  std::operator+(&local_438,"The type (one of: ",&local_458);
  std::operator+(&local_418,&local_438,")");
  auVar3._8_8_ = pRVar6;
  auVar3._0_8_ = in_stack_fffffffffffffb20;
  auVar3._16_8_ = pRVar7;
  auVar3._24_8_ = 0;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_fffffffffffffb40;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = pRVar9;
  RPCResult::RPCResult
            (&local_b8,STR,(string)ZEXT1632(CONCAT124(in_stack_fffffffffffffafc,uVar5)),
             (string)(auVar3 << 0x40),inner_02,SUB81(local_3f8,0));
  __l._M_len = 5;
  __l._M_array = local_2d8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (in_RDI,__l,(allocator_type *)&stack0xfffffffffffffb07);
  lVar4 = 0x220;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_2d8[0].m_type + lVar4));
    lVar4 = lVar4 + -0x88;
  } while (lVar4 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffb08);
  std::__cxx11::string::~string((string *)&local_418);
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::~string((string *)&local_458);
  std::__cxx11::string::~string(local_3f8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffb28);
  std::__cxx11::string::~string(local_3d8);
  std::__cxx11::string::~string(local_3b8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffb48);
  std::__cxx11::string::~string(local_398);
  std::__cxx11::string::~string(local_378);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_498);
  std::__cxx11::string::~string(local_358);
  std::__cxx11::string::~string(local_338);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_478);
  std::__cxx11::string::~string(local_318);
  std::__cxx11::string::~string(local_2f8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static std::vector<RPCResult> ScriptPubKeyDoc() {
    return
         {
             {RPCResult::Type::STR, "asm", "Disassembly of the output script"},
             {RPCResult::Type::STR, "desc", "Inferred descriptor for the output"},
             {RPCResult::Type::STR_HEX, "hex", "The raw output script bytes, hex-encoded"},
             {RPCResult::Type::STR, "address", /*optional=*/true, "The Bitcoin address (only if a well-defined address exists)"},
             {RPCResult::Type::STR, "type", "The type (one of: " + GetAllOutputTypes() + ")"},
         };
}